

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

int mcu8str_contains(mcu8str *str,char needle)

{
  char *pcVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    if (str->size == uVar2) {
      return 0;
    }
    pcVar1 = str->c_str + uVar2;
    uVar2 = uVar2 + 1;
  } while (*pcVar1 != needle);
  return 1;
}

Assistant:

int mcu8str_contains( const mcu8str* str, char needle )
  {
    const char * it = str->c_str;
    const char * itE = it + str->size;
    for ( ; it!=itE; ++it )
      if ( *it == needle )
        return 1;
    return 0;
  }